

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirinfo.c
# Opt level: O0

int tagCompare(void *a,void *b)

{
  int *piVar1;
  int *piVar2;
  int local_34;
  TIFFField *tb;
  TIFFField *ta;
  void *b_local;
  void *a_local;
  
  piVar1 = *a;
  piVar2 = *b;
  if (*piVar1 == *piVar2) {
    if (piVar1[2] == 0) {
      local_34 = 0;
    }
    else {
      local_34 = piVar2[2] - piVar1[2];
    }
    a_local._4_4_ = local_34;
  }
  else {
    a_local._4_4_ = *piVar1 - *piVar2;
  }
  return a_local._4_4_;
}

Assistant:

static int tagCompare(const void *a, const void *b)
{
    const TIFFField *ta = *(const TIFFField **)a;
    const TIFFField *tb = *(const TIFFField **)b;
    /* NB: be careful of return values for 16-bit platforms */
    if (ta->field_tag != tb->field_tag)
        return (int)ta->field_tag - (int)tb->field_tag;
    else
        return (ta->field_type == TIFF_ANY)
                   ? 0
                   : ((int)tb->field_type - (int)ta->field_type);
}